

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O3

void __thiscall Device::readChipId(Device *this,uint32_t *chipId,uint32_t *extChipId)

{
  uint32_t uVar1;
  Samba *this_00;
  
  uVar1 = Samba::readWord(this->_samba,0x400e0740);
  *chipId = uVar1;
  this_00 = this->_samba;
  if (uVar1 == 0) {
    uVar1 = Samba::readWord(this_00,0x400e0940);
    *chipId = uVar1;
    this_00 = this->_samba;
    if (uVar1 == 0) {
      uVar1 = Samba::readWord(this_00,0x6000f000);
      *chipId = uVar1;
      if (uVar1 == 0) {
        return;
      }
      this_00 = this->_samba;
      uVar1 = 0x6000f004;
    }
    else {
      uVar1 = 0x400e0944;
    }
  }
  else {
    uVar1 = 0x400e0744;
  }
  uVar1 = Samba::readWord(this_00,uVar1);
  *extChipId = uVar1;
  return;
}

Assistant:

void
Device::readChipId(uint32_t& chipId, uint32_t& extChipId)
{
    if ((chipId = _samba.readWord(0x400e0740)) != 0)
    {
        extChipId = _samba.readWord(0x400e0744);
    }
    else if ((chipId = _samba.readWord(0x400e0940)) != 0)
    {
        extChipId = _samba.readWord(0x400e0944);
    }else if((chipId = _samba.readWord(0x6000F000)) != 0)
    {
        extChipId = _samba.readWord(0x6000F004);
    }

    
}